

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPersistentModelIndex>::moveAppend
          (QGenericArrayOps<QPersistentModelIndex> *this,QPersistentModelIndex *b,
          QPersistentModelIndex *e)

{
  QPersistentModelIndex *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QPersistentModelIndex *in_RDI;
  QPersistentModelIndex *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QPersistentModelIndex>::begin
                        ((QArrayDataPointer<QPersistentModelIndex> *)0x8ef717);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QPersistentModelIndex::QPersistentModelIndex(this_00,in_RDI);
      local_10 = local_10 + 8;
      in_RDI[2].d = in_RDI[2].d + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }